

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_msg.c
# Opt level: O2

void send_loc_info(char *file,int line)

{
  FILE *fdes;
  LocMsg lmsg;
  
  lmsg.file = strdup(file);
  lmsg.line = line;
  fdes = get_pipe();
  ppack(fdes,CK_MSG_LOC,(CheckMsg *)&lmsg);
  free(lmsg.file);
  return;
}

Assistant:

void send_loc_info(const char *file, int line)
{
    LocMsg lmsg;

    lmsg.file = strdup(file);
    lmsg.line = line;
    ppack(get_pipe(), CK_MSG_LOC, (CheckMsg *) & lmsg);
    free(lmsg.file);
}